

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTreeTest.cc
# Opt level: O1

void run_randomized_test(void)

{
  long lVar1;
  long lVar2;
  FILE *pFVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  time_t tVar7;
  size_t sVar8;
  anon_union_8_2_94730038_for_Vector2<long>_3 *paVar9;
  const_iterator cVar10;
  anon_union_8_2_94730038_for_Vector2<long>_3 aVar11;
  KDTree<phosg::Vector2<long>,_long> *__range1;
  anon_union_8_2_94730018_for_Vector2<long>_1 aVar12;
  pair<phosg::Vector2<long>,_long> *it;
  bool bVar13;
  pair<std::_Rb_tree_iterator<std::pair<long,_long>_>,_bool> pVar14;
  pair<std::_Rb_tree_iterator<std::pair<long,_long>_>,_std::_Rb_tree_iterator<std::pair<long,_long>_>_>
  pVar15;
  KDTree<phosg::Vector2<long>,_long> t;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  remaining_points;
  Iterator __end1;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  points;
  KDTree<phosg::Vector2<long>,_long> local_1c8;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_1b8;
  long lStack_1b0;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_1a8;
  anon_union_8_2_94730038_for_Vector2<long>_3 aStack_1a0;
  long *local_198;
  anon_union_8_2_94730038_for_Vector2<long>_3 *local_190;
  long local_180;
  long *local_178;
  int local_158;
  undefined4 uStack_154;
  int iStack_150;
  undefined4 uStack_14c;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_140;
  long *plStack_138;
  long *local_130;
  long *local_110;
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  local_d8;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_a8;
  undefined8 local_a0;
  Iterator local_98;
  
  puts("-- randomized");
  puts("--   construction/insert");
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  local_1c8.root = (Node *)0x0;
  local_1c8.node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    iVar6 = rand();
    aVar12 = (anon_union_8_2_94730018_for_Vector2<long>_1)(long)(iVar6 % 1000);
    iVar6 = rand();
    aVar11 = (anon_union_8_2_94730038_for_Vector2<long>_3)(long)(iVar6 % 1000);
    local_1a8 = aVar12;
    aStack_1a0 = aVar11;
    pVar14 = std::
             _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
             ::_M_emplace_unique<std::pair<long,long>>
                       ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                         *)&local_d8,(pair<long,_long> *)&local_1a8);
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_140.x = aVar11.y * aVar12.x;
      local_1a8 = aVar12;
      aStack_1a0 = aVar11;
      phosg::KDTree<phosg::Vector2<long>,_long>::insert
                (&local_98,&local_1c8,(Vector2<long> *)&local_1a8,&local_140.x);
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_98);
    }
    sVar4 = local_1c8.node_count;
    pFVar3 = _stderr;
  } while (local_d8._M_impl.super__Rb_tree_header._M_node_count < 1000);
  sVar8 = phosg::KDTree<phosg::Vector2<long>,_long>::depth_recursive(local_1c8.root,0);
  fprintf(pFVar3,"--     tree: size=%zu, depth=%zu\n",sVar4,sVar8);
  puts("--   within");
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::_Rb_tree((_Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
              *)&local_1a8,&local_d8);
  local_1b8.x = 0xfa;
  lStack_1b0 = 0xfa;
  local_a8.x = 0x2ee;
  local_a0 = 0x2ee;
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            ((vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)&local_140,&local_1c8,(Vector2<long> *)&local_1b8,(Vector2<long> *)&local_a8);
  if ((long *)local_140.x != plStack_138) {
    aVar12 = local_140;
    do {
      phosg::expect_generic
                (0xf9 < *aVar12.x,"it.first.x < 250",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x24);
      phosg::expect_generic
                (*aVar12.x < 0x2ee,"it.first.x >= 750",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x25);
      phosg::expect_generic
                (0xf9 < *(long *)(aVar12.x + 8),"it.first.y < 250",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x26);
      phosg::expect_generic
                (*(long *)(aVar12.x + 8) < 0x2ee,"it.first.y >= 750",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x27);
      local_1b8.x = *aVar12.x;
      lStack_1b0 = *(long *)(aVar12.x + 8);
      pVar15 = std::
               _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
               ::equal_range((_Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                              *)&local_1a8,(key_type *)&local_1b8);
      lVar1 = local_180;
      std::
      _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
      ::_M_erase_aux((_Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      *)&local_1a8,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node)
      ;
      phosg::expect_generic
                (lVar1 - local_180 == 1,
                 "1 != remaining_points.erase(make_pair(it.first.x, it.first.y))",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x28);
      aVar12.x = aVar12.x + 0x18;
    } while ((long *)aVar12.x != plStack_138);
  }
  if ((long *)local_140.x != (long *)0x0) {
    operator_delete((void *)local_140,(long)local_130 - (long)local_140);
  }
  for (paVar9 = local_190; paVar9 != &aStack_1a0;
      paVar9 = (anon_union_8_2_94730038_for_Vector2<long>_3 *)
               std::_Rb_tree_increment((_Rb_tree_node_base *)paVar9)) {
    bVar13 = true;
    if (0xfffffffffffffe0b < paVar9[4].y - 0x2eeU) {
      bVar13 = (undefined1 *)((long)&((_Base_ptr)paVar9[5].y)[-0x18]._M_left + 2) <
               (undefined1 *)0xfffffffffffffe0c;
    }
    phosg::expect_generic
              (bVar13,
               "!((it.first < 250) || (it.first >= 750) || (it.second < 250) || (it.second >= 750))"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x2b);
  }
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
               *)&local_1a8);
  puts("--   erase 1");
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_1a8,local_1c8.root);
  while (phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
                   ((Iterator *)&local_140,(Node *)0x0),
        local_110 != local_130 || local_178 != local_198) {
    if ((local_178 == local_198) == (local_110 == local_130)) {
      lVar1 = *local_198;
      lVar2 = *local_130;
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_140);
      if (lVar1 == lVar2) goto LAB_00106098;
    }
    else {
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_140);
    }
    local_140.x._4_4_ = uStack_154;
    local_140.x._0_4_ = local_158;
    cVar10 = std::
             _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
             ::find(&local_d8,(key_type *)&local_140);
    phosg::expect_generic
              ((_Rb_tree_header *)cVar10._M_node != &local_d8._M_impl.super__Rb_tree_header,
               "1 != points.count(make_pair(it->first.x, it->first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x33);
    if ((iStack_150 + local_158 & 1U) == 0) {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_1a8);
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance(&local_1c8,(Iterator *)&local_1a8);
    }
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_140);
LAB_00106098:
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_1a8);
  sVar4 = local_1c8.node_count;
  pFVar3 = _stderr;
  sVar8 = phosg::KDTree<phosg::Vector2<long>,_long>::depth_recursive(local_1c8.root,0);
  fprintf(pFVar3,"--     tree: size=%zu, depth=%zu\n",sVar4,sVar8);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_1a8,local_1c8.root);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator((Iterator *)&local_140,(Node *)0x0);
  while ((iVar5 = iStack_150, iVar6 = local_158, local_110 != local_130 || local_178 != local_198 &&
         (((local_178 == local_198) != (local_110 == local_130) || (*local_198 != *local_130))))) {
    local_1b8.x._4_4_ = uStack_154;
    local_1b8.x._0_4_ = local_158;
    lStack_1b0 = CONCAT44(uStack_14c,iStack_150);
    cVar10 = std::
             _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
             ::find(&local_d8,(key_type *)&local_1b8);
    phosg::expect_generic
              ((_Rb_tree_header *)cVar10._M_node != &local_d8._M_impl.super__Rb_tree_header,
               "1 != points.count(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x3c);
    phosg::expect_generic
              ((iVar5 + iVar6 & 1U) == 0,"0 != (it.first.x + it.first.y) % 2",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x3d);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_1a8);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_140);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_1a8);
  puts("--   erase 2");
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_1a8,local_1c8.root);
  while (phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
                   ((Iterator *)&local_140,(Node *)0x0),
        local_110 != local_130 || local_178 != local_198) {
    if ((local_178 == local_198) == (local_110 == local_130)) {
      lVar1 = *local_198;
      lVar2 = *local_130;
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_140);
      if (lVar1 == lVar2) goto LAB_00106323;
    }
    else {
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_140);
    }
    local_140.x._4_4_ = uStack_154;
    local_140.x._0_4_ = local_158;
    cVar10 = std::
             _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
             ::find(&local_d8,(key_type *)&local_140);
    phosg::expect_generic
              ((_Rb_tree_header *)cVar10._M_node != &local_d8._M_impl.super__Rb_tree_header,
               "1 != points.count(make_pair(it->first.x, it->first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x45);
    if (((CONCAT44(uStack_154,local_158) < 0xfa) || (0x2ed < CONCAT44(uStack_154,local_158))) ||
       (499 < CONCAT44(uStack_14c,iStack_150) - 0xfaU)) {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_1a8);
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance(&local_1c8,(Iterator *)&local_1a8);
    }
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_140);
LAB_00106323:
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_1a8);
  sVar4 = local_1c8.node_count;
  pFVar3 = _stderr;
  sVar8 = phosg::KDTree<phosg::Vector2<long>,_long>::depth_recursive(local_1c8.root,0);
  fprintf(pFVar3,"--     tree: size=%zu, depth=%zu\n",sVar4,sVar8);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_1a8,local_1c8.root);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator((Iterator *)&local_140,(Node *)0x0);
  while ((iVar5 = iStack_150, iVar6 = local_158, local_110 != local_130 || local_178 != local_198 &&
         (((local_178 == local_198) != (local_110 == local_130) || (*local_198 != *local_130))))) {
    local_1b8.x._4_4_ = uStack_154;
    local_1b8.x._0_4_ = local_158;
    lStack_1b0 = CONCAT44(uStack_14c,iStack_150);
    cVar10 = std::
             _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
             ::find(&local_d8,(key_type *)&local_1b8);
    phosg::expect_generic
              ((_Rb_tree_header *)cVar10._M_node != &local_d8._M_impl.super__Rb_tree_header,
               "1 != points.count(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x4f);
    phosg::expect_generic
              ((iVar5 + iVar6 & 1U) == 0,"0 != (it.first.x + it.first.y) % 2",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x50);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_1a8);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_140);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_1a8);
  local_1a8.x = 0xfa;
  aStack_1a0.y = 0xfa;
  local_140.x = 0x2ee;
  plStack_138 = (long *)0x2ee;
  bVar13 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                     (&local_1c8,(Vector2<long> *)&local_1a8,(Vector2<long> *)&local_140);
  phosg::expect_generic
            (!bVar13,"false != t.exists({250, 250}, {750, 750})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x54);
  local_1a8.x = 0;
  aStack_1a0.y = 0;
  local_140.x = 1000;
  plStack_138 = (long *)0x3e8;
  bVar13 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                     (&local_1c8,(Vector2<long> *)&local_1a8,(Vector2<long> *)&local_140);
  phosg::expect_generic
            (bVar13,"true != t.exists({0, 0}, {1000, 1000})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x55);
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~_Rb_tree(&local_d8);
  phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree(&local_1c8);
  return;
}

Assistant:

void run_randomized_test() {
  printf("-- randomized\n");

  printf("--   construction/insert\n");
  srand(time(nullptr));
  KDTree<Vector2<int64_t>, int64_t> t;
  set<pair<int64_t, int64_t>> points;
  while (points.size() < 1000) {
    int64_t x = rand() % 1000;
    int64_t y = rand() % 1000;
    if (points.emplace(make_pair(x, y)).second) {
      t.insert({x, y}, x * y);
    }
  }
  fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());

  printf("--   within\n");
  {
    set<pair<int64_t, int64_t>> remaining_points = points;
    for (const auto& it : t.within({250, 250}, {750, 750})) {
      expect_ge(it.first.x, 250);
      expect_lt(it.first.x, 750);
      expect_ge(it.first.y, 250);
      expect_lt(it.first.y, 750);
      expect_eq(1, remaining_points.erase(make_pair(it.first.x, it.first.y)));
    }
    for (const auto& it : remaining_points) {
      expect((it.first < 250) || (it.first >= 750) || (it.second < 250) || (it.second >= 750));
    }
  }

  printf("--   erase 1\n");
  {
    // delete all points where x + y is an odd number
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, points.count(make_pair(it->first.x, it->first.y)));
      if ((it->first.x + it->first.y) % 2) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());
    for (auto it : t) {
      expect_eq(1, points.count(make_pair(it.first.x, it.first.y)));
      expect_eq(0, (it.first.x + it.first.y) % 2);
    }
  }

  printf("--   erase 2\n");
  {
    // delete all points in (250, 250) -> (750, 750)
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, points.count(make_pair(it->first.x, it->first.y)));
      if ((it->first.x >= 250) && (it->first.y >= 250) &&
          (it->first.x < 750) && (it->first.y < 750)) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());
    for (auto it : t) {
      expect_eq(1, points.count(make_pair(it.first.x, it.first.y)));
      expect_eq(0, (it.first.x + it.first.y) % 2);
    }
  }

  expect_eq(false, t.exists({250, 250}, {750, 750}));
  expect_eq(true, t.exists({0, 0}, {1000, 1000}));
}